

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::CBString(CBString *this,int len,char *s)

{
  size_t sVar1;
  uchar *__dest;
  CBStringException *pCVar2;
  uint uVar3;
  allocator local_89;
  CBStringException bstr__cppwrapper_exception;
  string local_60;
  string local_40;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_00180870;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    if (0x7ffffffe < sVar1) {
      std::__cxx11::string::string
                ((string *)&local_40,"CBString::Failure in (char *) constructor, string too large",
                 &local_89);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    (this->super_tagbstring).slen = (int)sVar1;
    uVar3 = (int)sVar1 + 1;
    if (len < (int)uVar3) {
      len = uVar3;
    }
    (this->super_tagbstring).mlen = len;
    __dest = (uchar *)malloc((ulong)(uint)len);
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,s,(ulong)uVar3);
      return;
    }
  }
  (this->super_tagbstring).data = (uchar *)0x0;
  std::__cxx11::string::string
            ((string *)&local_60,"CBString::Failure in (int len, char *) constructor",&local_89);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (int len, const char *s) {
	if (s) {
		size_t sslen = strlen (s);
		if (sslen >= INT_MAX) bstringThrow ("Failure in (char *) constructor, string too large")
		slen = (int) sslen;
		mlen = slen + 1;
		if (mlen < len) mlen = len;
		if (NULL != (data = (unsigned char *) bstr__alloc (mlen))) {
			bstr__memcpy (data, s, slen + 1);
			return;
		}
	}
	data = NULL;
	bstringThrow ("Failure in (int len, char *) constructor");
}